

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_net.cpp
# Opt level: O2

void __thiscall Net::propagate_front(Net *this,int cur_layer)

{
  pointer pvVar1;
  pointer pvVar2;
  double *pdVar3;
  long lVar4;
  double *i;
  double *pdVar5;
  double dVar6;
  _Vector_base<double,_std::allocator<double>_> _Stack_68;
  _Vector_base<double,_std::allocator<double>_> local_50;
  _Vector_base<double,_std::allocator<double>_> local_38;
  
  lVar4 = (long)cur_layer;
  pvVar1 = (this->weights).
           super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_50,
             (this->mesh).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar4 + -1);
  mult_matrix<double>((vector<double,_std::allocator<double>_> *)&_Stack_68,pvVar1 + lVar4,
                      (vector<double,_std::allocator<double>_> *)&local_50);
  add_matrix<double>((vector<double,_std::allocator<double>_> *)&local_38,
                     (vector<double,_std::allocator<double>_> *)&_Stack_68,
                     (this->biases).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar4);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            ((this->meshZ).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar4,&local_38);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_68);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_50);
  std::vector<double,_std::allocator<double>_>::operator=
            ((this->mesh).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar4,
             (this->meshZ).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar4);
  pvVar2 = (this->mesh).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar3 = *(pointer *)
            ((long)&pvVar2[lVar4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data + 8);
  for (pdVar5 = pvVar2[lVar4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar5 != pdVar3; pdVar5 = pdVar5 + 1) {
    dVar6 = function(this,*pdVar5);
    *pdVar5 = dVar6;
  }
  return;
}

Assistant:

void Net::propagate_front(int cur_layer){
    meshZ[cur_layer] = add_matrix<double>(mult_matrix<double>(weights[cur_layer], mesh[cur_layer-1]), biases[cur_layer]);
    mesh[cur_layer] = meshZ[cur_layer];
    for (double & i : mesh[cur_layer])
        i = function(i);
}